

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c6280_mame.c
# Opt level: O0

void c6280_calculate_clocks(c6280_t *p,double clk,double rate)

{
  double step;
  int i;
  double rate_local;
  double clk_local;
  c6280_t *p_local;
  
  for (step._4_4_ = 0; step._4_4_ < 0x1000; step._4_4_ = step._4_4_ + 1) {
    p->wave_freq_tab[(int)(step._4_4_ + 1U & 0xfff)] =
         (UINT32)(long)(((clk / rate) * 4096.0) / (double)(step._4_4_ + 1));
  }
  for (step._4_4_ = 0; step._4_4_ < 0x20; step._4_4_ = step._4_4_ + 1) {
    p->noise_freq_tab[step._4_4_] = (UINT32)(long)(((clk / rate) * 32.0) / (double)(step._4_4_ + 1))
    ;
  }
  return;
}

Assistant:

static void c6280_calculate_clocks(c6280_t *p, double clk, double rate)
{
	int i;
	double step;
	//double rate = clock / 16;

	/* Make waveform frequency table */
	for (i = 0; i < 4096; i += 1)
	{
		step = ((clk / rate) * 4096) / (i+1);
		p->wave_freq_tab[(1 + i) & 0xFFF] = (UINT32)step;
	}

	/* Make noise frequency table */
	for (i = 0; i < 32; i += 1)
	{
		step = ((clk / rate) * 32) / (i+1);
		p->noise_freq_tab[i] = (UINT32)step;
	}
}